

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

shared_ptr<OpenMD::SPFData> __thiscall OpenMD::Snapshot::getSPFData(Snapshot *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<OpenMD::SPFData> sVar1;
  
  std::__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xa60));
  sVar1.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<OpenMD::SPFData>)
         sVar1.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SPFData> Snapshot::getSPFData() { return frameData.spfData; }